

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void __thiscall MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin(MemoryLeakWarningPlugin *this)

{
  MemoryLeakWarningPlugin *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~MemoryLeakWarningPlugin(in_RDI);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

MemoryLeakWarningPlugin::~MemoryLeakWarningPlugin()
{
    if (destroyGlobalDetectorAndTurnOfMemoryLeakDetectionInDestructor_) {
        MemoryLeakWarningPlugin::turnOffNewDeleteOverloads();
        MemoryLeakWarningPlugin::destroyGlobalDetector();
    }
}